

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_ZONE(effect_handler_context_t *context)

{
  wchar_t typ;
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t dam;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  loc_conflict lVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  ulong uVar9;
  loc finish;
  int iVar10;
  bool bVar11;
  source sVar12;
  source origin;
  
  lVar6.y = 0;
  lVar6.x = (player->grid).x;
  uVar9 = (ulong)(uint)(player->grid).y;
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  typ = context->subtype;
  wVar1 = context->radius;
  wVar2 = context->other;
  if ((context->x != L'\0') && (context->y != L'\0')) {
    lVar6 = loc(context->x,context->y);
    uVar9 = (ulong)lVar6 >> 0x20;
  }
  wVar3 = (int)uVar9 - wVar1;
  wVar7 = (int)uVar9 + wVar1;
  if (wVar3 <= wVar7) {
    wVar4 = lVar6.x - wVar1;
    do {
      iVar10 = wVar1 * 2 + 1;
      wVar8 = wVar4;
      if (wVar4 <= lVar6.x + wVar1) {
        do {
          finish.y = wVar3;
          finish.x = wVar8;
          wVar5 = distance((loc_conflict)((ulong)lVar6 & 0xffffffff | uVar9 << 0x20),
                           (loc_conflict)finish);
          if ((wVar5 <= wVar1) && (wVar5 = Rand_div(100), wVar5 < wVar2)) {
            sVar12 = source_player();
            origin._4_4_ = 0;
            origin.what = sVar12.what;
            origin.which.trap = sVar12.which.trap;
            project(origin,L'\x01',finish,dam,typ,L'y',L'\0','\0',(object *)0x0);
          }
          iVar10 = iVar10 + -1;
          wVar8 = wVar8 + L'\x01';
        } while (iVar10 != 0);
      }
      bVar11 = wVar3 != wVar7;
      wVar3 = wVar3 + L'\x01';
    } while (bVar11);
  }
  return true;
}

Assistant:

bool effect_handler_ZONE(effect_handler_context_t *context)
{
	struct loc grid, centre = player->grid;
	int dam = effect_calculate_value(context, false);
	int rad = context->radius;
	int type = context->subtype;
	int chance = context->other;
	int flg = PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL |
		PROJECT_JUMP;

	/* Check for coordinates */
	if (context->x && context->y) {
		centre = loc(context->x, context->y);
	}

	/* Everything in range */
	for (grid.y = centre.y - rad; grid.y <= centre.y + rad; grid.y++) {
		for (grid.x = centre.x - rad; grid.x <= centre.x + rad; grid.x++) {
			int dist = distance(centre, grid);

			/* Skip distant grids */
			if (dist > rad) continue;

			/* Percentage chance of hitting */
			if (randint0(100) >= chance) continue;

			project(source_player(), 1, grid, dam, type, flg, 0, 0, NULL);
		}
	}
	return true;
}